

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O2

void __thiscall
NshHistoryEntryCount_SuccessWhenOverriding_Test::~NshHistoryEntryCount_SuccessWhenOverriding_Test
          (NshHistoryEntryCount_SuccessWhenOverriding_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshHistoryEntryCount, SuccessWhenOverriding)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    for (unsigned int i = 0; i < NSH_CMD_HISTORY_SIZE; i++) {
        nsh_history_add_entry(&hist, new_entry);
    }

    const char entry_override[] = "overriden";
    nsh_history_add_entry(&hist, entry_override);

    ASSERT_EQ(nsh_history_entry_count(&hist), NSH_CMD_HISTORY_SIZE);
}